

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::file_server::file_server(file_server *this,service *srv,bool async)

{
  mime_type *this_00;
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  bool bVar3;
  json_type jVar4;
  value *pvVar5;
  array *paVar6;
  mapped_type *pmVar7;
  cppcms_error *pcVar8;
  uint uVar9;
  ulong uVar10;
  file_server *pfVar11;
  file_server *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  string url;
  string canon_path;
  string mime_file;
  string input_path;
  undefined1 local_90 [32];
  undefined1 local_70 [64];
  
  application::application(&this->super_application,srv);
  (this->super_application)._vptr_application = (_func_int **)&PTR__file_server_002b4570;
  (this->document_root_)._M_dataplus._M_p = (pointer)&(this->document_root_).field_2;
  (this->document_root_)._M_string_length = 0;
  (this->document_root_).field_2._M_local_buf[0] = '\0';
  (this->alias_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alias_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alias_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->mime_;
  p_Var1 = &(this->mime_)._M_t._M_impl.super__Rb_tree_header;
  (this->mime_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mime_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mime_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mime_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mime_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->async_ = async;
  (this->index_file_)._M_dataplus._M_p = (pointer)&(this->index_file_).field_2;
  (this->index_file_)._M_string_length = 0;
  (this->index_file_).field_2._M_local_buf[0] = '\0';
  pvVar5 = application::settings(&this->super_application);
  pfVar11 = (file_server *)local_70;
  json::value::get_abi_cxx11_((string *)pfVar11,pvVar5,"file_server.document_root",".");
  bVar3 = canonical(pfVar11,(string *)local_70,&this->document_root_);
  std::__cxx11::string::~string((string *)local_70);
  if (!bVar3) {
    pcVar8 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_180,"Invalid document root",(allocator *)&mime_file);
    cppcms_error::cppcms_error(pcVar8,&local_180.first);
    __cxa_throw(pcVar8,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  pvVar5 = application::settings(&this->super_application);
  local_180.first._M_dataplus._M_p._0_1_ = 0;
  bVar3 = json::value::get<bool>(pvVar5,"file_server.listing",(bool *)&local_180);
  this->list_directories_ = bVar3;
  pvVar5 = application::settings(&this->super_application);
  json::value::get_abi_cxx11_(&local_180.first,pvVar5,"file_server.index","index.html");
  std::__cxx11::string::operator=((string *)&this->index_file_,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  pvVar5 = application::settings(&this->super_application);
  local_180.first._M_dataplus._M_p._0_1_ = 1;
  bVar3 = json::value::get<bool>(pvVar5,"file_server.check_symlink",(bool *)&local_180);
  this->check_symlinks_ = bVar3;
  pvVar5 = application::settings(&this->super_application);
  json::value::get_abi_cxx11_(&mime_file,pvVar5,"file_server.mime_types","");
  pvVar5 = application::settings(&this->super_application);
  local_180.first._M_dataplus._M_p._0_1_ = 0;
  bVar3 = json::value::get<bool>(pvVar5,"file_server.allow_deflate",(bool *)&local_180);
  this->allow_deflate_ = bVar3;
  pvVar5 = application::settings(&this->super_application);
  pvVar5 = json::value::find(pvVar5,"file_server.alias");
  jVar4 = json::value::type(pvVar5);
  if (jVar4 == is_array) {
    pvVar5 = application::settings(&this->super_application);
    pvVar5 = json::value::find(pvVar5,"file_server.alias");
    paVar6 = json::value::array(pvVar5);
    uVar9 = 0;
    pfVar11 = (file_server *)(local_70 + 0x20);
    while( true ) {
      uVar10 = (ulong)uVar9;
      pvVar2 = (paVar6->
               super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(paVar6->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) <= uVar10)
      break;
      json::value::get<std::__cxx11::string>(&url,pvVar2 + uVar10,"url");
      if ((url._M_string_length < 2) || (*url._M_dataplus._M_p != '/')) {
        pcVar8 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_180.first,"Invalid alias URL: ",&url);
        cppcms_error::cppcms_error(pcVar8,&local_180.first);
        __cxa_throw(pcVar8,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if (url._M_dataplus._M_p[url._M_string_length - 1] == '/') {
        std::__cxx11::string::resize((ulong)&url);
      }
      json::value::get<std::__cxx11::string>
                (&input_path,
                 (paVar6->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar10,"path");
      canon_path._M_dataplus._M_p = (pointer)&canon_path.field_2;
      canon_path._M_string_length = 0;
      canon_path.field_2._M_local_buf[0] = '\0';
      this_01 = pfVar11;
      std::__cxx11::string::string((string *)pfVar11,(string *)&input_path);
      bVar3 = canonical(this_01,(string *)pfVar11,&canon_path);
      std::__cxx11::string::~string((string *)pfVar11);
      if (!bVar3) {
        pcVar8 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_180.first,"Invalid alias path: ",&input_path);
        cppcms_error::cppcms_error(pcVar8,&local_180.first);
        __cxa_throw(pcVar8,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_180,&url,&canon_path);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->alias_,&local_180);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_180);
      std::__cxx11::string::~string((string *)&canon_path);
      std::__cxx11::string::~string((string *)&input_path);
      std::__cxx11::string::~string((string *)&url);
      uVar9 = uVar9 + 1;
    }
  }
  if (mime_file._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_180,".pdf",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".sig",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".spl",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".ps",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".torrent",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".dvi",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".gz",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".pac",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".swf",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".tgz",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".tar",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".zip",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".mp3",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".m3u",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".wma",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".wax",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".ogg",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".wav",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".gif",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".jpg",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".jpeg",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".png",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".xbm",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".xpm",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".xwd",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".css",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".html",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".htm",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".js",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".asc",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".c",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".cpp",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".log",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".conf",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".text",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".txt",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".dtd",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".xml",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".mpeg",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".mpg",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".mov",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".qt",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".avi",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".asf",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".asx",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".wmv",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".bz2",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string((string *)&local_180,".tbz",(allocator *)&url);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_180.first);
    std::__cxx11::string::assign((char *)pmVar7);
    this_02 = &local_180;
  }
  else {
    std::__cxx11::string::string((string *)local_90,(string *)&mime_file);
    load_mime_types(this,(string *)local_90);
    this_02 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_90;
  }
  std::__cxx11::string::~string((string *)this_02);
  std::__cxx11::string::~string((string *)&mime_file);
  return;
}

Assistant:

file_server::file_server(cppcms::service &srv,bool async) : application(srv), async_(async)
{
	if(!canonical(settings().get("file_server.document_root","."),document_root_))
		throw cppcms_error("Invalid document root");

	list_directories_ = settings().get("file_server.listing",false);
	index_file_ = settings().get("file_server.index","index.html");
	check_symlinks_ = settings().get("file_server.check_symlink",true);

	std::string mime_file=settings().get("file_server.mime_types","");

	allow_deflate_ = settings().get("file_server.allow_deflate",false);

	if(settings().find("file_server.alias").type()==json::is_array) {
		json::array const &alias = settings().find("file_server.alias").array();
		for(unsigned i=0;i<alias.size();i++) {
			std::string url = alias[i].get<std::string>("url");
			if(url.size() < 2 || url[0]!='/') {
				throw cppcms_error("Invalid alias URL: " + url);
			}
			if(url[url.size()-1]=='/')
				url.resize(url.size()-1);
			std::string input_path = alias[i].get<std::string>("path");
			std::string canon_path;
			if(!canonical(input_path,canon_path)) {
				throw cppcms_error("Invalid alias path: " + input_path);
			}
			alias_.push_back(std::make_pair(url,canon_path));
		}
	}

	if(mime_file.empty()) {
		mime_[".pdf"]	=      "application/pdf";
		mime_[".sig"]	=      "application/pgp-signature";
		mime_[".spl"]	=      "application/futuresplash";
		mime_[".ps"]	=      "application/postscript";
		mime_[".torrent"]=      "application/x-bittorrent";
		mime_[".dvi"]	=      "application/x-dvi";
		mime_[".gz"]	=      "application/x-gzip";
		mime_[".pac"]	=      "application/x-ns-proxy-autoconfig";
		mime_[".swf"]	=      "application/x-shockwave-flash";
		mime_[".tgz"]	=      "application/x-tgz";
		mime_[".tar"]	=      "application/x-tar";
		mime_[".zip"]	=      "application/zip";
		mime_[".mp3"]	=      "audio/mpeg";
		mime_[".m3u"]	=      "audio/x-mpegurl";
		mime_[".wma"]	=      "audio/x-ms-wma";
		mime_[".wax"]	=      "audio/x-ms-wax";
		mime_[".ogg"]	=      "application/ogg";
		mime_[".wav"]	=      "audio/x-wav";
		mime_[".gif"]	=      "image/gif";
		mime_[".jpg"]	=      "image/jpeg";
		mime_[".jpeg"]	=      "image/jpeg";
		mime_[".png"]	=      "image/png";
		mime_[".xbm"]	=      "image/x-xbitmap";
		mime_[".xpm"]	=      "image/x-xpixmap";
		mime_[".xwd"]	=      "image/x-xwindowdump";
		mime_[".css"]	=      "text/css";
		mime_[".html"]	=      "text/html";
		mime_[".htm"]	=      "text/html";
		mime_[".js"]	=      "text/javascript";
		mime_[".asc"]	=      "text/plain";
		mime_[".c"]	=      "text/plain";
		mime_[".cpp"]	=      "text/plain";
		mime_[".log"]	=      "text/plain";
		mime_[".conf"]	=      "text/plain";
		mime_[".text"]	=      "text/plain";
		mime_[".txt"]	=      "text/plain";
		mime_[".dtd"]	=      "text/xml";
		mime_[".xml"]	=      "text/xml";
		mime_[".mpeg"]	=      "video/mpeg";
		mime_[".mpg"]	=      "video/mpeg";
		mime_[".mov"]	=      "video/quicktime";
		mime_[".qt"]	=      "video/quicktime";
		mime_[".avi"]	=      "video/x-msvideo";
		mime_[".asf"]	=      "video/x-ms-asf";
		mime_[".asx"]	=      "video/x-ms-asf";
		mime_[".wmv"]	=      "video/x-ms-wmv";
		mime_[".bz2"]	=      "application/x-bzip";
		mime_[".tbz"]	=      "application/x-bzip-compressed-tar";
	}
	else {
		load_mime_types(mime_file);
	}

}